

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_13::NameResolver::BeginIfExceptExpr(NameResolver *this,IfExceptExpr *expr)

{
  IfExceptExpr *expr_local;
  NameResolver *this_local;
  
  PushLabel(this,&(expr->true_).label);
  ResolveBlockDeclarationVar(this,&(expr->true_).decl);
  ResolveExceptionVar(this,&expr->except_var);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameResolver::BeginIfExceptExpr(IfExceptExpr* expr) {
  PushLabel(expr->true_.label);
  ResolveBlockDeclarationVar(&expr->true_.decl);
  ResolveExceptionVar(&expr->except_var);
  return Result::Ok;
}